

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O1

Vec_Wec_t * Gia_ManComputeMffcs(Gia_Man_t *p,int LimitMin,int LimitMax,int SuppMax,int RatioBest)

{
  Gia_Obj_t *pObj;
  uint uVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  int *piVar4;
  int iVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  Vec_Int_t *__ptr;
  Vec_Int_t *p_00;
  Vec_Wec_t *pVVar8;
  Vec_Int_t *pVVar9;
  Vec_Int_t *p_01;
  int iVar10;
  long lVar11;
  ulong uVar12;
  size_t __nmemb;
  uint uVar13;
  long lVar14;
  int **ppiVar15;
  
  if (p->pMuxes == (uint *)0x0) {
    __assert_fail("p->pMuxes",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaResub.c"
                  ,0x67,"Vec_Wec_t *Gia_ManComputeMffcs(Gia_Man_t *, int, int, int, int)");
  }
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < LimitMax * 2 - 1U) {
    iVar5 = LimitMax * 2;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = iVar5;
  lVar11 = (long)iVar5;
  if (iVar5 == 0) {
    piVar7 = (int *)0x0;
  }
  else {
    piVar7 = (int *)malloc(lVar11 * 4);
  }
  pVVar6->pArray = piVar7;
  __ptr = (Vec_Int_t *)malloc(0x10);
  __ptr->nSize = 0;
  __ptr->nCap = iVar5;
  if (iVar5 == 0) {
    piVar7 = (int *)0x0;
  }
  else {
    piVar7 = (int *)malloc(lVar11 * 4);
  }
  __ptr->pArray = piVar7;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nSize = 0;
  p_00->nCap = iVar5;
  if (iVar5 == 0) {
    piVar7 = (int *)0x0;
  }
  else {
    piVar7 = (int *)malloc(lVar11 << 2);
  }
  p_00->pArray = piVar7;
  pVVar8 = (Vec_Wec_t *)malloc(0x10);
  pVVar8->nCap = 1000;
  pVVar8->nSize = 0;
  pVVar9 = (Vec_Int_t *)calloc(1000,0x10);
  pVVar8->pArray = pVVar9;
  Gia_ManCreateRefs(p);
  uVar12 = (ulong)(uint)p->nObjs;
  if (0 < p->nObjs) {
    lVar11 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pObj = p->pObjs + lVar11;
      if ((~*(uint *)pObj & 0x1fffffff) != 0 && -1 < (int)*(uint *)pObj) {
        if ((int)uVar12 <= lVar11) {
LAB_007442dd:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        if (p->pRefs[lVar11] != 0) {
          pVVar6->nSize = 0;
          iVar5 = Gia_ObjCheckMffc_rec(p,pObj,LimitMax,pVVar6);
          if (iVar5 != 0) {
            __ptr->nSize = 0;
            p_00->nSize = 0;
            qsort(pVVar6->pArray,(long)pVVar6->nSize,4,Vec_IntSortCompare1);
            if (0 < pVVar6->nSize) {
              lVar14 = 0;
              do {
                iVar10 = pVVar6->pArray[lVar14];
                if (p->pRefs[iVar10] < 1) {
                  if ((iVar10 < 0) || (p->nObjs <= iVar10)) {
                    __assert_fail("v >= 0 && v < p->nObjs",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                                  ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
                  }
                  if ((~*(uint *)(p->pObjs + iVar10) & 0x9fffffff) == 0) goto LAB_00743e91;
                  uVar12 = (ulong)(uint)p_00->nSize;
                  pVVar9 = p_00;
                  if (uVar12 != 0) {
                    if (p_00->nSize < 1) goto LAB_00744280;
                    piVar7 = p_00->pArray;
                    goto LAB_00743eac;
                  }
LAB_00743eb2:
                  Vec_IntPush(pVVar9,iVar10);
                }
                else {
LAB_00743e91:
                  uVar12 = (ulong)(uint)__ptr->nSize;
                  pVVar9 = __ptr;
                  if (uVar12 == 0) goto LAB_00743eb2;
                  if (__ptr->nSize < 1) {
LAB_00744280:
                    __assert_fail("p->nSize > 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                                  ,0x1f8,"int Vec_IntEntryLast(Vec_Int_t *)");
                  }
                  piVar7 = __ptr->pArray;
LAB_00743eac:
                  if (piVar7[uVar12 - 1] != iVar10) goto LAB_00743eb2;
                }
                lVar14 = lVar14 + 1;
              } while (lVar14 < pVVar6->nSize);
            }
            pGVar3 = p->pObjs;
            if ((pObj < pGVar3) || (pGVar3 + p->nObjs <= pObj)) goto LAB_007442dd;
            Vec_IntPush(p_00,(int)((ulong)((long)pObj - (long)pGVar3) >> 2) * -0x55555555);
          }
          if (0 < pVVar6->nSize) {
            piVar7 = pVVar6->pArray;
            piVar4 = p->pRefs;
            lVar14 = 0;
            do {
              piVar4[piVar7[lVar14]] = piVar4[piVar7[lVar14]] + 1;
              lVar14 = lVar14 + 1;
            } while (lVar14 < pVVar6->nSize);
          }
          if ((iVar5 != 0) && (iVar5 = p_00->nSize, LimitMin <= iVar5)) {
            uVar1 = __ptr->nSize;
            if ((int)uVar1 <= SuppMax) {
              uVar13 = pVVar8->nCap;
              uVar2 = pVVar8->nSize;
              if (uVar2 == uVar13) {
                lVar14 = (long)(int)uVar13;
                if ((int)uVar13 < 0x10) {
                  if (pVVar8->pArray == (Vec_Int_t *)0x0) {
                    pVVar9 = (Vec_Int_t *)malloc(0x100);
                  }
                  else {
                    pVVar9 = (Vec_Int_t *)realloc(pVVar8->pArray,0x100);
                  }
                  pVVar8->pArray = pVVar9;
                  memset(pVVar9 + lVar14,0,(0x10 - lVar14) * 0x10);
                  iVar10 = 0x10;
                }
                else {
                  iVar10 = uVar13 * 2;
                  if (iVar10 <= (int)uVar13) goto LAB_00744044;
                  if (pVVar8->pArray == (Vec_Int_t *)0x0) {
                    pVVar9 = (Vec_Int_t *)malloc((ulong)uVar13 << 5);
                  }
                  else {
                    pVVar9 = (Vec_Int_t *)realloc(pVVar8->pArray,(ulong)uVar13 << 5);
                  }
                  pVVar8->pArray = pVVar9;
                  memset(pVVar9 + lVar14,0,lVar14 * 0x10);
                }
                pVVar8->nCap = iVar10;
              }
LAB_00744044:
              uVar13 = uVar2 + 1;
              pVVar8->nSize = uVar13;
              if ((int)uVar2 < 0) {
                __assert_fail("p->nSize > 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWec.h"
                              ,0x9f,"Vec_Int_t *Vec_WecEntryLast(Vec_Wec_t *)");
              }
              pVVar9 = pVVar8->pArray;
              p_01 = pVVar9 + ((ulong)uVar13 - 1);
              iVar10 = iVar5 + uVar1 + 0x14;
              if (p_01->nCap < iVar10) {
                if (pVVar9[(ulong)uVar13 - 1].pArray == (int *)0x0) {
                  piVar7 = (int *)malloc((long)iVar10 << 2);
                }
                else {
                  piVar7 = (int *)realloc(pVVar9[(ulong)uVar13 - 1].pArray,(long)iVar10 << 2);
                }
                pVVar9[(ulong)uVar13 - 1].pArray = piVar7;
                if (piVar7 == (int *)0x0) {
                  __assert_fail("p->pArray",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                                ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
                }
                p_01->nCap = iVar10;
              }
              Vec_IntPush(p_01,(int)lVar11);
              Vec_IntPush(p_01,uVar1);
              Vec_IntPush(p_01,iVar5);
              if (0 < (int)uVar1) {
                piVar7 = __ptr->pArray;
                uVar12 = 0;
                do {
                  Vec_IntPush(p_01,piVar7[uVar12]);
                  uVar12 = uVar12 + 1;
                } while (uVar1 != uVar12);
              }
              Vec_IntPush(p_01,(iVar5 * 1000) / (int)uVar1);
            }
          }
        }
      }
      lVar11 = lVar11 + 1;
      uVar12 = (ulong)p->nObjs;
    } while (lVar11 < (long)uVar12);
  }
  if (pVVar6->pArray != (int *)0x0) {
    free(pVVar6->pArray);
    pVVar6->pArray = (int *)0x0;
  }
  free(pVVar6);
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (int *)0x0;
  }
  free(__ptr);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  pVVar6 = pVVar8->pArray;
  iVar5 = pVVar8->nSize;
  __nmemb = (size_t)iVar5;
  qsort(pVVar6,__nmemb,0x10,Vec_WecSortCompare6);
  if (0 < (long)__nmemb) {
    lVar11 = 0;
    do {
      iVar10 = *(int *)((long)&pVVar6->nSize + lVar11);
      if (iVar10 < 1) {
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x3b1,"int Vec_IntPop(Vec_Int_t *)");
      }
      *(int *)((long)&pVVar6->nSize + lVar11) = iVar10 + -1;
      lVar11 = lVar11 + 0x10;
    } while (__nmemb << 4 != lVar11);
  }
  uVar1 = (RatioBest * iVar5) / 100;
  if ((int)uVar1 < iVar5) {
    ppiVar15 = &pVVar6[uVar1].pArray;
    uVar13 = uVar1;
    do {
      if (RatioBest * iVar5 < -99) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWec.h"
                      ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      if (*ppiVar15 != (int *)0x0) {
        free(*ppiVar15);
        *ppiVar15 = (int *)0x0;
      }
      ((Vec_Int_t *)(ppiVar15 + -1))->nCap = 0;
      ((Vec_Int_t *)(ppiVar15 + -1))->nSize = 0;
      ppiVar15 = ppiVar15 + 2;
      uVar13 = uVar13 + 1;
    } while ((int)uVar13 < iVar5);
  }
  if (iVar5 < (int)uVar1) {
    __assert_fail("iPivot <= Vec_WecSize(vMffcs)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaResub.c"
                  ,0x8e,"Vec_Wec_t *Gia_ManComputeMffcs(Gia_Man_t *, int, int, int, int)");
  }
  pVVar8->nSize = uVar1;
  return pVVar8;
}

Assistant:

Vec_Wec_t * Gia_ManComputeMffcs( Gia_Man_t * p, int LimitMin, int LimitMax, int SuppMax, int RatioBest )
{
    Gia_Obj_t * pObj;
    Vec_Wec_t * vMffcs;
    Vec_Int_t * vNodes, * vLeaves, * vInners, * vMffc;
    int i, iPivot;
    assert( p->pMuxes );
    vNodes  = Vec_IntAlloc( 2 * LimitMax );
    vLeaves = Vec_IntAlloc( 2 * LimitMax );
    vInners = Vec_IntAlloc( 2 * LimitMax );
    vMffcs  = Vec_WecAlloc( 1000 );
    Gia_ManCreateRefs( p );
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( !Gia_ObjRefNum(p, pObj) )
            continue;
        if ( !Gia_ObjCheckMffc(p, pObj, LimitMax, vNodes, vLeaves, vInners) )
            continue;
        if ( Vec_IntSize(vInners) < LimitMin )
            continue;
        if ( Vec_IntSize(vLeaves) > SuppMax )
            continue;
        // improve cut
        // collect cut
        vMffc = Vec_WecPushLevel( vMffcs );
        Vec_IntGrow( vMffc, Vec_IntSize(vLeaves) + Vec_IntSize(vInners) + 20 );
        Vec_IntPush( vMffc, i );
        Vec_IntPush( vMffc, Vec_IntSize(vLeaves) );
        Vec_IntPush( vMffc, Vec_IntSize(vInners) );
        Vec_IntAppend( vMffc, vLeaves );
//        Vec_IntAppend( vMffc, vInners );
        // add last entry equal to the ratio
        Vec_IntPush( vMffc, 1000 * Vec_IntSize(vInners) / Vec_IntSize(vLeaves) );
    }
    Vec_IntFree( vNodes );
    Vec_IntFree( vLeaves );
    Vec_IntFree( vInners );
    // sort MFFCs by their inner/leaf ratio
    Vec_WecSortByLastInt( vMffcs, 1 );
    Vec_WecForEachLevel( vMffcs, vMffc, i )
        Vec_IntPop( vMffc );
    // remove those whose ratio is not good
    iPivot = RatioBest * Vec_WecSize(vMffcs) / 100;
    Vec_WecForEachLevelStart( vMffcs, vMffc, i, iPivot )
        Vec_IntErase( vMffc );
    assert( iPivot <= Vec_WecSize(vMffcs) );
    Vec_WecShrink( vMffcs, iPivot );
    return vMffcs;
}